

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O1

bool __thiscall Ruleset::isSameType(Ruleset *this,Card *c1,Card *c2)

{
  pointer ppRVar1;
  uint uVar2;
  Suit SVar3;
  Suit SVar4;
  pointer ppRVar5;
  bool bVar6;
  
  ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar5 != ppRVar1) {
    uVar2 = 0;
    do {
      uVar2 = (**(*ppRVar5)->_vptr_Rule)(*ppRVar5,(ulong)(uVar2 & 1),c1);
      ppRVar5 = ppRVar5 + 1;
    } while (ppRVar5 != ppRVar1);
    if ((char)uVar2 != '\0') {
      ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppRVar5 != ppRVar1) {
        uVar2 = 0;
        do {
          uVar2 = (**(*ppRVar5)->_vptr_Rule)(*ppRVar5,(ulong)(uVar2 & 1),c2);
          ppRVar5 = ppRVar5 + 1;
        } while (ppRVar5 != ppRVar1);
        if ((char)uVar2 != '\0') {
          return true;
        }
      }
    }
  }
  ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar5 == ppRVar1) {
LAB_0010705c:
    ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppRVar5 != ppRVar1) {
      uVar2 = 0;
      do {
        uVar2 = (**(*ppRVar5)->_vptr_Rule)(*ppRVar5,(ulong)(uVar2 & 1),c2);
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 != ppRVar1);
      if ((char)uVar2 != '\0') goto LAB_0010708a;
    }
    SVar3 = Card::suit(c1);
    SVar4 = Card::suit(c2);
    bVar6 = SVar3 == SVar4;
  }
  else {
    uVar2 = 0;
    do {
      uVar2 = (**(*ppRVar5)->_vptr_Rule)(*ppRVar5,(ulong)(uVar2 & 1),c1);
      ppRVar5 = ppRVar5 + 1;
    } while (ppRVar5 != ppRVar1);
    if ((char)uVar2 == '\0') goto LAB_0010705c;
LAB_0010708a:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Ruleset::isSameType(const Card &c1, const Card &c2) {
    if (isTrump(c1) && isTrump(c2)) return true;
    else {
        if (isTrump(c1) || isTrump(c2)) return false;
        return c1.suit() == c2.suit();
    }
}